

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhinull.cpp
# Opt level: O0

bool __thiscall QNullRenderBuffer::create(QNullRenderBuffer *this)

{
  QRhiImplementation *in_RDI;
  undefined1 unaff_retaddr;
  QRhiNull *rhiD;
  QRhiImplementation *this_00;
  
  this_00 = in_RDI;
  if (((ulong)(in_RDI->resUpdPool).super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.ptr
      & 1) != 0) {
    (*in_RDI->_vptr_QRhiImplementation[3])();
  }
  *(undefined1 *)
   &(in_RDI->resUpdPool).super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.ptr = 1;
  *(int *)((long)&(in_RDI->resUpdPool).super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.
                  ptr + 4) =
       *(int *)((long)&(in_RDI->resUpdPool).super_QVLABase<QRhiResourceUpdateBatch_*>.
                       super_QVLABaseBase.ptr + 4) + 1;
  QRhiImplementation::registerResource(this_00,(QRhiResource *)rhiD,(bool)unaff_retaddr);
  return true;
}

Assistant:

bool QNullRenderBuffer::create()
{
    if (valid)
        destroy();

    valid = true;
    generation += 1;

    QRHI_RES_RHI(QRhiNull);
    rhiD->registerResource(this);

    return true;
}